

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

panel * get_panel_midleft(void)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  panel *p;
  panel_line *ppVar4;
  byte attr;
  undefined1 *puVar5;
  
  p = (panel *)mem_zalloc(0x18);
  p->len = 0;
  p->max = 9;
  ppVar4 = (panel_line *)mem_zalloc(0x168);
  p->lines = ppVar4;
  wVar3 = weight_remaining(player);
  attr = (byte)((uint)wVar3 >> 0x1f) ^ 0xd;
  panel_line(p,(player->max_lev <= player->lev) * '\x02' + '\v',"Level","%d");
  panel_line(p,(player->max_exp <= player->exp) * '\x02' + '\v',"Cur Exp","%d");
  panel_line(p,'\r',"Max Exp","%d",(ulong)(uint)player->max_exp);
  if ((long)player->lev < 0x32) {
    puVar5 = show_adv_exp_buffer;
    strnfmt(show_adv_exp_buffer,0x1e,"%ld",
            (long)((int)((uint)player->expfact * *(int *)(&DAT_0027542c + (long)player->lev * 4)) /
                  100));
  }
  else {
    puVar5 = "********";
  }
  panel_line(p,'\r',"Adv Exp","%s",puVar5);
  panel_space(p);
  panel_line(p,'\r',"Gold","%d",(ulong)(uint)player->au);
  panel_line(p,attr,"Burden","%.1f lb",(double)((float)player->upkeep->total_weight / 10.0));
  iVar2 = (int)((ulong)((long)wVar3 * -0x66666667) >> 0x20);
  wVar1 = -wVar3;
  if (L'\0' < wVar3) {
    wVar1 = wVar3;
  }
  panel_line(p,attr,"Overweight","%d.%d lb",(ulong)(uint)((iVar2 >> 2) - (iVar2 >> 0x1f)),
             (ulong)((uint)wVar1 % 10));
  if (player->max_depth == 0) {
    puVar5 = "Town";
  }
  else {
    puVar5 = show_depth_buffer;
    strnfmt(show_depth_buffer,0xd,"%d\' (L%d)",(ulong)(uint)(player->max_depth * 0x32));
  }
  panel_line(p,'\r',"Max Depth","%s",puVar5);
  return p;
}

Assistant:

static struct panel *get_panel_midleft(void) {
	struct panel *p = panel_allocate(9);
	int diff = weight_remaining(player);
	uint8_t attr = diff < 0 ? COLOUR_L_RED : COLOUR_L_GREEN;

	panel_line(p, max_color(player->lev, player->max_lev),
			"Level", "%d", player->lev);
	panel_line(p, max_color(player->exp, player->max_exp),
			"Cur Exp", "%d", player->exp);
	panel_line(p, COLOUR_L_GREEN, "Max Exp", "%d", player->max_exp);
	panel_line(p, COLOUR_L_GREEN, "Adv Exp", "%s", show_adv_exp());
	panel_space(p);
	panel_line(p, COLOUR_L_GREEN, "Gold", "%d", player->au);
	panel_line(p, attr, "Burden", "%.1f lb",
			   player->upkeep->total_weight / 10.0F);
	panel_line(p, attr, "Overweight", "%d.%d lb", -diff / 10, abs(diff) % 10);
	panel_line(p, COLOUR_L_GREEN, "Max Depth", "%s", show_depth());

	return p;
}